

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_annotations.cc
# Opt level: O0

void AnnotateMemoryIsInitialized(char *param_1,int param_2,void *mem,size_t size)

{
  size_t size_local;
  void *mem_local;
  int param_1_local;
  char *param_0_local;
  
  return;
}

Assistant:

void AnnotateMemoryIsInitialized(const char *, int,
                                 const volatile void *mem, size_t size) {
#if __has_feature(memory_sanitizer)
  __msan_unpoison(mem, size);
#else
  (void)mem;
  (void)size;
#endif
}